

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example5.cpp
# Opt level: O0

int main(void)

{
  size_t *this;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *__cp;
  RTPTime RStack_10958;
  RTPTime RStack_10950;
  RTPPacket *pRStack_10948;
  RTPPacket *pack;
  RTPIPv4Address addr;
  RTPSessionParams sessparams;
  RTPUDPv4TransmissionParams transparams;
  uint uStack_10818;
  int num;
  int i;
  int status;
  string ipstr;
  uint16_t uStack_107e8;
  uint16_t uStack_107e6;
  uint32_t destip;
  uint16_t destport;
  uint16_t portbase;
  undefined1 auStack_107d8 [8];
  RTPSession sess;
  MyMemoryManager mgr;
  
  this = &sess.byepackets.
          super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
          ._M_impl._M_node._M_size;
  MyMemoryManager::MyMemoryManager((MyMemoryManager *)this);
  jrtplib::RTPSession::RTPSession
            ((RTPSession *)auStack_107d8,(RTPRandom *)0x0,(RTPMemoryManager *)this);
  std::__cxx11::string::string((string *)&i);
  poVar3 = std::operator<<((ostream *)&std::cout,"Enter local portbase:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,&uStack_107e6);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Enter the destination IP address");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,(string *)&i);
  __cp = (char *)std::__cxx11::string::c_str();
  ipstr.field_2._12_4_ = inet_addr(__cp);
  if (ipstr.field_2._12_4_ == 0xffffffff) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Bad IP address specified");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    mgr.freecount = -1;
    transparams.m_pAbortDesc._0_4_ = 1;
  }
  else {
    ipstr.field_2._12_4_ = ntohl(ipstr.field_2._12_4_);
    poVar3 = std::operator<<((ostream *)&std::cout,"Enter the destination port");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::istream::operator>>((istream *)&std::cin,&uStack_107e8);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Number of packets you wish to be sent:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::istream::operator>>((istream *)&std::cin,(int *)((long)&transparams.m_pAbortDesc + 4));
    jrtplib::RTPUDPv4TransmissionParams::RTPUDPv4TransmissionParams
              ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety);
    jrtplib::RTPSessionParams::RTPSessionParams((RTPSessionParams *)&addr.port);
    jrtplib::RTPSessionParams::SetOwnTimestampUnit((RTPSessionParams *)&addr.port,0.1);
    jrtplib::RTPSessionParams::SetAcceptOwnPackets((RTPSessionParams *)&addr.port,true);
    jrtplib::RTPUDPv4TransmissionParams::SetPortbase
              ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety,uStack_107e6);
    iVar2 = jrtplib::RTPSession::Create
                      ((RTPSession *)auStack_107d8,(RTPSessionParams *)&addr.port,
                       (RTPTransmissionParams *)&sessparams.m_needThreadSafety,IPv4UDPProto);
    checkerror(iVar2);
    jrtplib::RTPIPv4Address::RTPIPv4Address
              ((RTPIPv4Address *)&pack,ipstr.field_2._12_4_,uStack_107e8,false);
    iVar2 = jrtplib::RTPSession::AddDestination((RTPSession *)auStack_107d8,(RTPAddress *)&pack);
    checkerror(iVar2);
    for (uStack_10818 = 1; (int)uStack_10818 <= (int)transparams.m_pAbortDesc._4_4_;
        uStack_10818 = uStack_10818 + 1) {
      printf("\nSending packet %d/%d\n",(ulong)uStack_10818,(ulong)transparams.m_pAbortDesc._4_4_);
      iVar2 = jrtplib::RTPSession::SendPacket
                        ((RTPSession *)auStack_107d8,"1234567890",10,'\0',false,10);
      checkerror(iVar2);
      jrtplib::RTPSession::BeginDataAccess((RTPSession *)auStack_107d8);
      bVar1 = jrtplib::RTPSession::GotoFirstSourceWithData((RTPSession *)auStack_107d8);
      if (bVar1) {
        do {
          while (pRStack_10948 = jrtplib::RTPSession::GetNextPacket((RTPSession *)auStack_107d8),
                pRStack_10948 != (RTPPacket *)0x0) {
            printf("Got packet !\n");
            jrtplib::RTPSession::DeletePacket((RTPSession *)auStack_107d8,pRStack_10948);
          }
          bVar1 = jrtplib::RTPSession::GotoNextSourceWithData((RTPSession *)auStack_107d8);
        } while (bVar1);
      }
      jrtplib::RTPSession::EndDataAccess((RTPSession *)auStack_107d8);
      iVar2 = jrtplib::RTPSession::Poll((RTPSession *)auStack_107d8);
      checkerror(iVar2);
      jrtplib::RTPTime::RTPTime(&RStack_10950,1,0);
      jrtplib::RTPTime::Wait(&RStack_10950);
    }
    jrtplib::RTPTime::RTPTime(&RStack_10958,10,0);
    jrtplib::RTPSession::BYEDestroy((RTPSession *)auStack_107d8,&RStack_10958,(void *)0x0,0);
    mgr.freecount = 0;
    transparams.m_pAbortDesc._0_4_ = 1;
    jrtplib::RTPIPv4Address::~RTPIPv4Address((RTPIPv4Address *)&pack);
    jrtplib::RTPSessionParams::~RTPSessionParams((RTPSessionParams *)&addr.port);
    jrtplib::RTPUDPv4TransmissionParams::~RTPUDPv4TransmissionParams
              ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety);
  }
  std::__cxx11::string::~string((string *)&i);
  jrtplib::RTPSession::~RTPSession((RTPSession *)auStack_107d8);
  MyMemoryManager::~MyMemoryManager
            ((MyMemoryManager *)
             &sess.byepackets.
              super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
              ._M_impl._M_node._M_size);
  return mgr.freecount;
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	MyMemoryManager mgr;
	RTPSession sess(0, &mgr);
	uint16_t portbase,destport;
	uint32_t destip;
	std::string ipstr;
	int status,i,num;

        // First, we'll ask for the necessary information
		
	std::cout << "Enter local portbase:" << std::endl;
	std::cin >> portbase;
	std::cout << std::endl;
	
	std::cout << "Enter the destination IP address" << std::endl;
	std::cin >> ipstr;
	destip = inet_addr(ipstr.c_str());
	if (destip == INADDR_NONE)
	{
		std::cerr << "Bad IP address specified" << std::endl;
		return -1;
	}
	
	// The inet_addr function returns a value in network byte order, but
	// we need the IP address in host byte order, so we use a call to
	// ntohl
	destip = ntohl(destip);
	
	std::cout << "Enter the destination port" << std::endl;
	std::cin >> destport;
	
	std::cout << std::endl;
	std::cout << "Number of packets you wish to be sent:" << std::endl;
	std::cin >> num;
	
	// Now, we'll create a RTP session, set the destination, send some
	// packets and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be sending 10 samples each second, so we'll
	// put the timestamp unit to (1.0/10.0)
	sessparams.SetOwnTimestampUnit(1.0/10.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	RTPIPv4Address addr(destip,destport);
	
	status = sess.AddDestination(addr);
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		printf("\nSending packet %d/%d\n",i,num);
		
		// send the packet
		status = sess.SendPacket((void *)"1234567890",10,0,false,10);
		checkerror(status);
		
		sess.BeginDataAccess();
		
		// check incoming packets
		if (sess.GotoFirstSourceWithData())
		{
			do
			{
				RTPPacket *pack;
				
				while ((pack = sess.GetNextPacket()) != NULL)
				{
					// You can examine the data here
					printf("Got packet !\n");
					
					// we don't longer need the packet, so
					// we'll delete it
					sess.DeletePacket(pack);
				}
			} while (sess.GotoNextSourceWithData());
		}
		
		sess.EndDataAccess();

#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}